

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_scandir(uv_fs_t *req)

{
  int iVar1;
  uv__dirent_t *puStack_20;
  int n;
  uv__dirent_t **dents;
  uv_fs_t *req_local;
  
  puStack_20 = (uv__dirent_t *)0x0;
  dents = (uv__dirent_t **)req;
  iVar1 = scandir(req->path,(dirent ***)&stack0xffffffffffffffe0,uv__fs_scandir_filter,
                  uv__fs_scandir_sort);
  *(undefined4 *)((long)dents + 0x124) = 0;
  if (iVar1 == 0) {
    free(puStack_20);
    puStack_20 = (uv__dirent_t *)0x0;
  }
  else if (iVar1 == -1) goto LAB_00455cf3;
  dents[0xc] = puStack_20;
LAB_00455cf3:
  req_local = (uv_fs_t *)(long)iVar1;
  return (ssize_t)req_local;
}

Assistant:

static ssize_t uv__fs_scandir(uv_fs_t* req) {
  uv__dirent_t** dents;
  int n;

  dents = NULL;
  n = scandir(req->path, &dents, uv__fs_scandir_filter, uv__fs_scandir_sort);

  /* NOTE: We will use nbufs as an index field */
  req->nbufs = 0;

  if (n == 0) {
    /* OS X still needs to deallocate some memory.
     * Memory was allocated using the system allocator, so use free() here.
     */
    free(dents);
    dents = NULL;
  } else if (n == -1) {
    return n;
  }

  req->ptr = dents;

  return n;
}